

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_coalesce_expr(JSParseState *s,int parse_flags)

{
  int iVar1;
  int iVar2;
  undefined4 in_ESI;
  long in_RDI;
  int label1;
  int in_stack_00000010;
  int in_stack_00000014;
  JSParseState *in_stack_00000018;
  JSParseState *in_stack_00000048;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = js_parse_logical_and_or
                    ((JSParseState *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  if (iVar1 == 0) {
    if (*(int *)(in_RDI + 0x18) == -0x5a) {
      iVar1 = new_label((JSParseState *)0x19bbeb);
      do {
        iVar2 = next_token(in_stack_00000048);
        if (iVar2 != 0) {
          return -1;
        }
        emit_op((JSParseState *)CONCAT44(parse_flags,label1),
                (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18));
        emit_op((JSParseState *)CONCAT44(parse_flags,label1),
                (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18));
        emit_goto((JSParseState *)CONCAT44(in_ESI,iVar1),0,0x19bc3a);
        emit_op((JSParseState *)CONCAT44(parse_flags,label1),
                (uint8_t)((uint)in_stack_fffffffffffffffc >> 0x18));
        iVar2 = js_parse_expr_binary(in_stack_00000018,in_stack_00000014,in_stack_00000010);
        if (iVar2 != 0) {
          return -1;
        }
      } while (*(int *)(in_RDI + 0x18) == -0x5a);
      emit_label((JSParseState *)CONCAT44(in_ESI,iVar1),0);
    }
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static __exception int js_parse_coalesce_expr(JSParseState *s, int parse_flags)
{
    int label1;
    
    if (js_parse_logical_and_or(s, TOK_LOR, parse_flags))
        return -1;
    if (s->token.val == TOK_DOUBLE_QUESTION_MARK) {
        label1 = new_label(s);
        for(;;) {
            if (next_token(s))
                return -1;
            
            emit_op(s, OP_dup);
            emit_op(s, OP_is_undefined_or_null);
            emit_goto(s, OP_if_false, label1);
            emit_op(s, OP_drop);
            
            if (js_parse_expr_binary(s, 8, parse_flags & ~PF_ARROW_FUNC))
                return -1;
            if (s->token.val != TOK_DOUBLE_QUESTION_MARK)
                break;
        }
        emit_label(s, label1);
    }
    return 0;
}